

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.hpp
# Opt level: O0

void __thiscall ot::commissioner::JoinerSession::~JoinerSession(JoinerSession *this)

{
  JoinerSession *this_local;
  
  coap::Resource::~Resource(&this->mResourceJoinFin);
  coap::Coap::~Coap(&this->mCoap);
  std::shared_ptr<ot::commissioner::DtlsSession>::~shared_ptr(&this->mDtlsSession);
  std::shared_ptr<ot::commissioner::JoinerSession::RelaySocket>::~shared_ptr(&this->mRelaySocket);
  std::__cxx11::string::~string((string *)&this->mJoinerPSKd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->mJoinerId);
  std::enable_shared_from_this<ot::commissioner::JoinerSession>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<ot::commissioner::JoinerSession>);
  return;
}

Assistant:

~JoinerSession()                                      = default;